

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

uint pugi::impl::anon_unknown_0::string_to_integer<unsigned_int>(char_t *value,uint minv,uint maxv)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  char_t *s;
  char *pcVar5;
  ulong uVar6;
  char_t *pcVar7;
  char cVar8;
  uint uVar9;
  char_t *pcVar10;
  bool bVar11;
  
  lVar4 = 0;
  do {
    lVar3 = lVar4;
    bVar1 = value[lVar3];
    lVar4 = lVar3 + 1;
  } while (((anonymous_namespace)::chartype_table[bVar1] & 8) != 0);
  uVar6 = (ulong)((bVar1 - 0x2b & 0xfd) == 0);
  if ((value[lVar3 + uVar6] == '0') && ((value[lVar4 + uVar6] & 0xdfU) == 0x58)) {
    pcVar5 = value + lVar4 + uVar6 + 1;
    do {
      cVar8 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar8 == '0');
    uVar6 = 0;
    uVar2 = 0;
    do {
      uVar9 = (int)cVar8 - 0x30;
      if (uVar9 < 10) {
        uVar2 = uVar2 << 4 | uVar9;
      }
      else {
        uVar9 = (int)cVar8 | 0x20;
        if (5 < uVar9 - 0x61) goto LAB_0033e8bb;
        uVar2 = (uVar2 * 0x10 + uVar9) - 0x57;
      }
      cVar8 = *pcVar5;
      uVar6 = uVar6 + 1;
      pcVar5 = pcVar5 + 1;
    } while( true );
  }
  pcVar7 = (char_t *)(uVar6 + lVar4);
  do {
    pcVar10 = pcVar7;
    cVar8 = value[(long)(pcVar10 + -1)];
    pcVar7 = pcVar10 + 1;
  } while (cVar8 == 0x30);
  uVar9 = (int)cVar8 - 0x30;
  uVar2 = 0;
  pcVar10 = value + (long)(pcVar10 + -1);
  if (uVar9 < 10) {
    uVar2 = 0;
    do {
      uVar2 = uVar9 + uVar2 * 10;
      pcVar5 = pcVar10 + 1;
      pcVar10 = pcVar10 + 1;
      uVar9 = (int)*pcVar5 - 0x30;
    } while (uVar9 < 10);
  }
  if ((char_t *)0x9 < pcVar10 + (-(long)pcVar7 - (long)value) + 2) {
    bVar11 = true;
    if (pcVar10 + (-8 - (long)value) != pcVar7) goto LAB_0033e8d6;
    if ('3' < cVar8) {
      bVar11 = -1 < (int)uVar2 || cVar8 != '4';
      goto LAB_0033e8d6;
    }
  }
  bVar11 = false;
LAB_0033e8d6:
  if (bVar1 == 0x2d) {
    uVar9 = -uVar2;
    if (-minv < uVar2) {
      uVar9 = minv;
    }
    if (bVar11) {
      uVar9 = minv;
    }
    return uVar9;
  }
  if (maxv <= uVar2) {
    uVar2 = maxv;
  }
  if (bVar11) {
    uVar2 = maxv;
  }
  return uVar2;
LAB_0033e8bb:
  bVar11 = 8 < uVar6;
  goto LAB_0033e8d6;
}

Assistant:

PUGI_IMPL_FN PUGI_IMPL_UNSIGNED_OVERFLOW U string_to_integer(const char_t* value, U minv, U maxv)
	{
		U result = 0;
		const char_t* s = value;

		while (PUGI_IMPL_IS_CHARTYPE(*s, ct_space))
			s++;

		bool negative = (*s == '-');

		s += (*s == '+' || *s == '-');

		bool overflow = false;

		if (s[0] == '0' && (s[1] | ' ') == 'x')
		{
			s += 2;

			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 16 + (*s - '0');
				else if (static_cast<unsigned>((*s | ' ') - 'a') < 6)
					result = result * 16 + ((*s | ' ') - 'a' + 10);
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			overflow = digits > sizeof(U) * 2;
		}
		else
		{
			// since overflow detection relies on length of the sequence skip leading zeros
			while (*s == '0')
				s++;

			const char_t* start = s;

			for (;;)
			{
				if (static_cast<unsigned>(*s - '0') < 10)
					result = result * 10 + (*s - '0');
				else
					break;

				s++;
			}

			size_t digits = static_cast<size_t>(s - start);

			PUGI_IMPL_STATIC_ASSERT(sizeof(U) == 8 || sizeof(U) == 4 || sizeof(U) == 2);

			const size_t max_digits10 = sizeof(U) == 8 ? 20 : sizeof(U) == 4 ? 10 : 5;
			const char_t max_lead = sizeof(U) == 8 ? '1' : sizeof(U) == 4 ? '4' : '6';
			const size_t high_bit = sizeof(U) * 8 - 1;

			overflow = digits >= max_digits10 && !(digits == max_digits10 && (*start < max_lead || (*start == max_lead && result >> high_bit)));
		}

		if (negative)
		{
			// Workaround for crayc++ CC-3059: Expected no overflow in routine.
		#ifdef _CRAYC
			return (overflow || result > ~minv + 1) ? minv : ~result + 1;
		#else
			return (overflow || result > 0 - minv) ? minv : 0 - result;
		#endif
		}
		else
			return (overflow || result > maxv) ? maxv : result;
	}